

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize-test.c++
# Opt level: O2

void __thiscall capnp::_::anon_unknown_0::TestCase475::run(TestCase475 *this)

{
  TestInputStream input;
  AlignedData<4> data;
  char local_198 [8];
  undefined8 local_190;
  undefined4 local_188;
  Runnable local_180;
  undefined1 *local_178;
  undefined8 *local_170;
  Maybe<kj::Exception> e;
  
  local_178 = (undefined1 *)&input;
  input.pos = (char *)&data;
  data.words[2].content = (word)0;
  data.words[3].content = (word)0;
  data.words[0].content = (word)0x300000000;
  data.words[1].content = (word)0x200000000;
  input.super_InputStream._vptr_InputStream = (_func_int **)&PTR__BufferedInputStream_003936a0;
  input.end = local_198;
  input.lazy = false;
  local_170 = &local_190;
  local_188 = 0x40;
  local_190 = 2;
  local_180._vptr_Runnable = (_func_int **)&PTR_run_003939d0;
  kj::_::runCatchingExceptions(&e,&local_180);
  if ((e.ptr.isSet == false) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[30],char_const(&)[33]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/serialize-test.c++"
               ,0x1ec,ERROR,
               "\"failed: expected \" \"e != nullptr\", \"Should have thrown an exception.\"",
               (char (*) [30])"failed: expected e != nullptr",
               (char (*) [33])"Should have thrown an exception.");
  }
  kj::_::NullableValue<kj::Exception>::~NullableValue(&e.ptr);
  kj::BufferedInputStream::~BufferedInputStream((BufferedInputStream *)&input);
  return;
}

Assistant:

TEST(Serialize, RejectHugeMessage) {
  // A message whose root struct contains two words of data!
  AlignedData<4> data = {{0,0,0,0,3,0,0,0, 0,0,0,0,2,0,0,0, 0,0,0,0,0,0,0,0, 0,0,0,0,0,0,0,0}};

  TestInputStream input(kj::arrayPtr(data.words, 4), false);

  // We'll set the traversal limit to 2 words so our 3-word message is too big.
  ReaderOptions options;
  options.traversalLimitInWords = 2;

  kj::Maybe<kj::Exception> e = kj::runCatchingExceptions([&]() {
    InputStreamMessageReader reader(input, options);
#if !KJ_NO_EXCEPTIONS
    ADD_FAILURE() << "Should have thrown an exception.";
#endif
  });

  KJ_EXPECT(e != nullptr, "Should have thrown an exception.");
}